

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O2

int anon_unknown.dwarf_112cf::RtMidiIn_getmessage(lua_State *L)

{
  pointer puVar1;
  pointer puVar2;
  RtMidiIn *this;
  int iVar3;
  ulong uVar4;
  double dVar5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this = getRtMidiIn(L,1);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar5 = RtMidiIn::getMessage
                    (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  puVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
  if (((dVar5 != 0.0) || (NAN(dVar5))) ||
     (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish)) {
    lua_pushnumber(L);
    lua_createtable(L,(long)puVar2 - (long)puVar1 & 0xffffffff,0);
    uVar4 = 0;
    iVar3 = 2;
    while ((long)puVar2 - (long)puVar1 != uVar4) {
      lua_pushinteger(L,local_48._M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
      lua_rawseti(L,0xfffffffe,uVar4 & 0xffffffff);
    }
  }
  else {
    iVar3 = 0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return iVar3;
}

Assistant:

int RtMidiIn_getmessage(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	auto msg = std::vector<unsigned char> { };
	double dt = self.getMessage(&msg);
	if (dt == 0.0 && msg.empty())
		return 0;

	auto n = msg.size();
	lua_pushnumber(L, dt);
	lua_createtable(L, n, 0);
	for (std::size_t i = 0; i < n; ++i) {
		lua_pushinteger(L, msg[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 2;
}